

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reaction.cpp
# Opt level: O3

ostream * IO::operator<<(ostream *output,Reaction *reaction)

{
  ostream *poVar1;
  _Rb_tree_node_base *p_Var2;
  double *pdVar3;
  
  std::__ostream_insert<char,std::char_traits<char>>(output,"    Reaction Data\n",0x12);
  std::__ostream_insert<char,std::char_traits<char>>(output,"    (\n",6);
  std::__ostream_insert<char,std::char_traits<char>>(output,"        Reversible  : ",0x16);
  poVar1 = std::ostream::_M_insert<bool>(SUB81(output,0));
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"        P Dependent : ",0x16);
  poVar1 = std::ostream::_M_insert<bool>(SUB81(poVar1,0));
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"        Duplicate : ",0x14);
  poVar1 = std::ostream::_M_insert<bool>(SUB81(poVar1,0));
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"        Reactants\n",0x12);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"        (\n",10);
  for (p_Var2 = (reaction->reactants_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var2 != &(reaction->reactants_)._M_t._M_impl.super__Rb_tree_header;
      p_Var2 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var2)) {
    std::__ostream_insert<char,std::char_traits<char>>(output,"            Name : ",0x13);
    *(undefined8 *)(output + *(long *)(*(long *)output + -0x18) + 0x10) = 10;
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                       (output,*(char **)(p_Var2 + 1),(long)p_Var2[1]._M_parent);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1," | Stoich : ",0xc);
    poVar1 = std::ostream::_M_insert<double>(*(double *)(p_Var2 + 2));
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
  }
  std::__ostream_insert<char,std::char_traits<char>>(output,"        )\n",10);
  std::__ostream_insert<char,std::char_traits<char>>(output,"        Products\n",0x11);
  std::__ostream_insert<char,std::char_traits<char>>(output,"        (\n",10);
  for (p_Var2 = (reaction->products_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var2 != &(reaction->products_)._M_t._M_impl.super__Rb_tree_header;
      p_Var2 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var2)) {
    std::__ostream_insert<char,std::char_traits<char>>(output,"            Name : ",0x13);
    *(undefined8 *)(output + *(long *)(*(long *)output + -0x18) + 0x10) = 10;
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                       (output,*(char **)(p_Var2 + 1),(long)p_Var2[1]._M_parent);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1," | Stoich : ",0xc);
    poVar1 = std::ostream::_M_insert<double>(*(double *)(p_Var2 + 2));
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
  }
  std::__ostream_insert<char,std::char_traits<char>>(output,"        )\n",10);
  std::__ostream_insert<char,std::char_traits<char>>(output,"        Arrhenius\n",0x12);
  std::__ostream_insert<char,std::char_traits<char>>(output,"        (\n",10);
  std::__ostream_insert<char,std::char_traits<char>>(output,"            Forward A = ",0x18);
  poVar1 = std::ostream::_M_insert<double>((reaction->forwardArrhenius_).A);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"                    n = ",0x18);
  poVar1 = std::ostream::_M_insert<double>((reaction->forwardArrhenius_).n);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"                    E = ",0x18);
  poVar1 = std::ostream::_M_insert<double>((reaction->forwardArrhenius_).E);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"            Reverse A = ",0x18);
  poVar1 = std::ostream::_M_insert<double>((reaction->reverseArrhenius_).A);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"                    n = ",0x18);
  poVar1 = std::ostream::_M_insert<double>((reaction->reverseArrhenius_).n);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"                    E = ",0x18);
  poVar1 = std::ostream::_M_insert<double>((reaction->reverseArrhenius_).E);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"        )\n",10);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"        Third Bodies\n",0x15);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"        (\n",10);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"            Third Body : ",0x19);
  poVar1 = std::ostream::_M_insert<bool>(SUB81(poVar1,0));
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
  for (p_Var2 = (reaction->thirdBodies_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var2 != &(reaction->thirdBodies_)._M_t._M_impl.super__Rb_tree_header;
      p_Var2 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var2)) {
    std::__ostream_insert<char,std::char_traits<char>>(output,"            Name : ",0x13);
    *(undefined8 *)(output + *(long *)(*(long *)output + -0x18) + 0x10) = 10;
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                       (output,*(char **)(p_Var2 + 1),(long)p_Var2[1]._M_parent);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1," | Efficiency Factor : ",0x17);
    poVar1 = std::ostream::_M_insert<double>(*(double *)(p_Var2 + 2));
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
  }
  pdVar3 = (reaction->LOW_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pdVar3 != (reaction->LOW_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish) {
    do {
      std::__ostream_insert<char,std::char_traits<char>>(output,"            LOW : ",0x12);
      poVar1 = std::ostream::_M_insert<double>(*pdVar3);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
      pdVar3 = pdVar3 + 1;
    } while (pdVar3 != (reaction->LOW_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_finish);
  }
  pdVar3 = (reaction->TROE_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pdVar3 != (reaction->TROE_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish) {
    do {
      std::__ostream_insert<char,std::char_traits<char>>(output,"            TROE : ",0x13);
      poVar1 = std::ostream::_M_insert<double>(*pdVar3);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
      pdVar3 = pdVar3 + 1;
    } while (pdVar3 != (reaction->TROE_).super__Vector_base<double,_std::allocator<double>_>._M_impl
                       .super__Vector_impl_data._M_finish);
  }
  pdVar3 = (reaction->SRI_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pdVar3 != (reaction->SRI_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish) {
    do {
      std::__ostream_insert<char,std::char_traits<char>>(output,"            SRI : ",0x12);
      poVar1 = std::ostream::_M_insert<double>(*pdVar3);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
      pdVar3 = pdVar3 + 1;
    } while (pdVar3 != (reaction->SRI_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_finish);
  }
  std::__ostream_insert<char,std::char_traits<char>>(output,"        )\n",10);
  std::__ostream_insert<char,std::char_traits<char>>(output,"    )",5);
  return output;
}

Assistant:

ostream& operator<<(ostream& output, const Reaction& reaction)
    {
        multimap<string,double>::const_iterator iter;
        vector<double>::const_iterator iterVec;

        output << "    Reaction Data\n"
               << "    (\n"
               << "        Reversible  : " << reaction.flagReversible_ << "\n"
               << "        P Dependent : " << reaction.flagPressureDependent_ << "\n"
               << "        Duplicate : " << reaction.flagDuplicate_ << "\n"
               << "        Reactants\n"
               << "        (\n";
       for (iter = reaction.reactants_.begin(); iter != reaction.reactants_.end(); ++iter)
       {
        output << "            Name : " << setw(10) <<iter->first << " | Stoich : " << iter->second << "\n";
       }
        output << "        )\n"
               << "        Products\n"
               << "        (\n";
       for (iter = reaction.products_.begin(); iter != reaction.products_.end(); ++iter)
       {
        output << "            Name : " << setw(10) <<iter->first << " | Stoich : " << iter->second << "\n";
       }
        output << "        )\n"
               << "        Arrhenius\n"
               << "        (\n"
               << "            Forward A = " << reaction.forwardArrhenius_.A << "\n"
               << "                    n = " << reaction.forwardArrhenius_.n << "\n"
               << "                    E = " << reaction.forwardArrhenius_.E << "\n"
               << "            Reverse A = " << reaction.reverseArrhenius_.A << "\n"
               << "                    n = " << reaction.reverseArrhenius_.n << "\n"
               << "                    E = " << reaction.reverseArrhenius_.E << "\n"
               << "        )\n"
               << "        Third Bodies\n"
               << "        (\n"
               << "            Third Body : " << reaction.flagThirdBody_ << "\n";
       for (iter = reaction.thirdBodies_.begin(); iter != reaction.thirdBodies_.end(); ++iter)
       {
        output << "            Name : " << setw(10) <<iter->first << " | Efficiency Factor : " << iter->second << "\n";
       }
       for (iterVec = reaction.LOW_.begin(); iterVec != reaction.LOW_.end(); ++iterVec)
       {
        output << "            LOW : " << *iterVec << "\n";
       }
       for (iterVec = reaction.TROE_.begin(); iterVec != reaction.TROE_.end(); ++iterVec)
       {
        output << "            TROE : " << *iterVec << "\n";
       }
       for (iterVec = reaction.SRI_.begin(); iterVec != reaction.SRI_.end(); ++iterVec)
       {
        output << "            SRI : " << *iterVec << "\n";
       }
        output << "        )\n"
               << "    )";
        return output;
    }